

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_list(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  char **ppcVar1;
  uint uVar2;
  lysp_node *plVar3;
  lysp_ext_instance *object;
  yin_subelement *subelems_00;
  LY_ERR LVar4;
  LY_ERR LVar5;
  lysp_node *parent;
  lysp_node **pplVar6;
  lysp_node *plVar7;
  LY_ERR ret__;
  yin_subelement *subelems;
  char **local_78;
  uint16_t *local_70;
  char **local_68;
  lysp_ext_instance **local_60;
  lysp_node *local_58;
  lysp_node **local_50;
  lysp_qname **local_48;
  char **local_40;
  char **local_38;
  
  subelems = (yin_subelement *)0x0;
  parent = (lysp_node *)calloc(1,0x90);
  if (parent == (lysp_node *)0x0) {
    LVar4 = LY_EMEM;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_list");
  }
  else {
    pplVar6 = node_meta->nodes;
    plVar3 = *pplVar6;
    if (*pplVar6 != (lysp_node *)0x0) {
      do {
        plVar7 = plVar3;
        plVar3 = plVar7->next;
      } while (plVar3 != (lysp_node *)0x0);
      pplVar6 = &plVar7->next;
    }
    *pplVar6 = parent;
    parent->nodetype = 0x10;
    parent->parent = node_meta->parent;
    LVar4 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar4 == LY_SUCCESS) {
      LVar4 = yin_parse_attribute(ctx,YIN_ARG_NAME,&parent->name,Y_IDENTIF_ARG,LY_STMT_LIST);
      if (LVar4 == LY_SUCCESS) {
        ppcVar1 = &parent[1].ref;
        local_70 = &parent->flags;
        local_38 = &parent->dsc;
        local_40 = &parent[1].dsc;
        local_48 = &parent->iffeatures;
        local_50 = &parent[1].next;
        local_58 = parent + 1;
        local_60 = &parent[1].exts;
        local_68 = &parent->ref;
        local_78 = &parent[1].name;
        LVar5 = subelems_allocator(ctx,0x19,parent,&subelems,8,&parent[1].iffeatures,0,0x20,ppcVar1,
                                   0,0x40,ppcVar1,0,0x200,ppcVar1,0,0x50000,local_70,2,0x400,ppcVar1
                                   ,0,0x80000,local_38,2,0x800,local_40,0,0x130000,local_48,0,
                                   0x160000,local_50,2,0x1000,ppcVar1,0,0x2000,ppcVar1,0,0x4000,
                                   ppcVar1,0,0x190000,parent,2,0x1a0000,parent,2,
                                   "t lysp_module *, struct lysc_node *, struct ly_set *, ly_bool)",
                                   local_58,0,1,local_60,0,0x1f0000,local_70,2,0x270000,local_68,2,
                                   0x2c0000,local_70,2,0x2f0000,local_78,0,0x300000);
        subelems_00 = subelems;
        LVar4 = LY_EMEM;
        if (LVar5 == LY_SUCCESS) {
          LVar4 = yin_parse_content(ctx,subelems,0x19,parent,LY_STMT_LIST,(char **)0x0,&parent->exts
                                   );
          subelems_deallocator(0x19,subelems_00);
          if ((LVar4 == LY_SUCCESS) &&
             ((object = parent->exts, object == (lysp_ext_instance *)0x0 ||
              (LVar4 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0),
              LVar4 == LY_SUCCESS)))) {
            LVar4 = LY_SUCCESS;
            if ((*(uint *)&parent[2].field_0xc != 0) &&
               (uVar2._0_2_ = parent[2].nodetype, uVar2._2_2_ = parent[2].flags, LVar4 = LY_SUCCESS,
               *(uint *)&parent[2].field_0xc < uVar2)) {
              ly_vlog((ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],(char *)0x0,
                      LYVE_SEMANTICS,
                      "Invalid combination of min-elements and max-elements: min value %u is bigger than the max value %u."
                     );
              LVar4 = LY_EVALID;
            }
          }
        }
      }
    }
  }
  return LVar4;
}

Assistant:

static LY_ERR
yin_parse_list(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    struct lysp_node_list *list;
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    size_t subelems_size;

    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, list, next, LY_EMEM);
    list->nodetype = LYS_LIST;
    list->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &list->name, Y_IDENTIF_ARG, LY_STMT_LIST));

    /* parse list content */
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 25, (struct lysp_node *)list, &subelems,
            LY_STMT_ACTION, &list->actions, 0,
            LY_STMT_ANYDATA, &list->child, 0,
            LY_STMT_ANYXML, &list->child, 0,
            LY_STMT_CHOICE, &list->child, 0,
            LY_STMT_CONFIG, &list->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_CONTAINER, &list->child, 0,
            LY_STMT_DESCRIPTION, &list->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_GROUPING, &list->groupings, 0,
            LY_STMT_IF_FEATURE, &list->iffeatures, 0,
            LY_STMT_KEY, &list->key, YIN_SUBELEM_UNIQUE,
            LY_STMT_LEAF, &list->child, 0,
            LY_STMT_LEAF_LIST, &list->child, 0,
            LY_STMT_LIST, &list->child, 0,
            LY_STMT_MAX_ELEMENTS, list, YIN_SUBELEM_UNIQUE,
            LY_STMT_MIN_ELEMENTS, list, YIN_SUBELEM_UNIQUE,
            LY_STMT_MUST, &list->musts, 0,
            LY_STMT_NOTIFICATION, &list->notifs, 0,
            LY_STMT_ORDERED_BY, &list->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &list->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_STATUS, &list->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_TYPEDEF, &list->typedefs, 0,
            LY_STMT_UNIQUE, &list->uniques, 0,
            LY_STMT_USES, &list->child, 0,
            LY_STMT_WHEN, &list->when, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));
    ret = yin_parse_content(ctx, subelems, subelems_size, list, LY_STMT_LIST, NULL, &list->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, list->exts));

    if (list->max && (list->min > list->max)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_MINMAX, list->min, list->max);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}